

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void digest_str(uchar *digest,size_t digest_len,char *str,size_t max_len)

{
  int index;
  uint i;
  size_t max_len_local;
  char *str_local;
  size_t digest_len_local;
  uchar *digest_local;
  
  max_len_local = max_len;
  if (digest_len * 2 + 1 < max_len) {
    max_len_local = digest_len * 2 + 1;
  }
  str[max_len_local - 1] = '\0';
  for (i = 0; (ulong)i < max_len_local - 1; i = i + 1) {
    if ((i & 1) == 0) {
      str[i] = "0123456789abcdef"[(int)(uint)digest[(int)(i >> 1)] >> 4];
    }
    else {
      str[i] = "0123456789abcdef"[(int)(digest[(int)(i >> 1)] & 0xf)];
    }
  }
  return;
}

Assistant:

static void digest_str(const unsigned char *digest, size_t digest_len, char *str, size_t max_len)
{
	unsigned i;
	if(max_len > digest_len * 2 + 1)
	{
		max_len = digest_len * 2 + 1;
	}
	str[max_len - 1] = 0;
	max_len -= 1;
	for(i = 0; i < max_len; i++)
	{
		static const char HEX[] = "0123456789abcdef";
		int index = i / 2;
		if(i % 2 == 0)
		{
			str[i] = HEX[digest[index] >> 4];
		}
		else
		{
			str[i] = HEX[digest[index] & 0xf];
		}
	}
}